

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O1

vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *
dg::dda::gatherNonPhisDefs<dg::dda::RWNode::DefUses>
          (vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *__return_storage_ptr__,
          ReadWriteGraph *graph,DefUses *nodes,bool intraproc)

{
  pointer *pppRVar1;
  uint uVar2;
  pointer ppRVar3;
  RWNode *phi;
  __node_base _Var4;
  iterator __position;
  bool bVar5;
  ReadWriteGraph *pRVar6;
  mapped_type *pmVar7;
  byte bVar8;
  long lVar9;
  size_type __n;
  ulong uVar10;
  pointer ppRVar11;
  const_iterator __begin2;
  SparseBitvectorHashImpl ret;
  SparseBitvectorHashImpl phis;
  const_iterator local_d8;
  uint local_bc;
  ReadWriteGraph *local_b8;
  RWNode *local_b0;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_a8;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_a8._M_buckets = &local_a8._M_single_bucket;
  local_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a8._M_element_count = 0;
  local_a8._M_bucket_count = 1;
  local_a8._M_rehash_policy._M_max_load_factor = 1.0;
  local_a8._M_rehash_policy._4_4_ = 0;
  local_a8._M_rehash_policy._M_next_resize = 0;
  local_a8._M_single_bucket = (__node_base_ptr)0x0;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_bucket_count = 1;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._4_4_ = 0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  ppRVar11 = (nodes->defuse).
             super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppRVar3 = (nodes->defuse).
            super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_b8 = graph;
  if (ppRVar11 != ppRVar3) {
    local_bc = (uint)intraproc;
    do {
      phi = *ppRVar11;
      if ((4 < phi->type - PHI) || (phi->type - INARG < 4 && intraproc)) {
        uVar2 = (phi->super_SubgraphNode<dg::dda::RWNode>).id;
        local_d8.container_it.
        super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur._0_4_
             = uVar2 & 0xffffffc0;
        local_d8.container_it.
        super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur._4_4_
             = 0;
        pmVar7 = std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_a8,(key_type *)&local_d8);
        *pmVar7 = *pmVar7 | 1L << ((char)uVar2 -
                                   (char)local_d8.container_it.
                                         super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                         ._M_cur & 0x3fU);
      }
      else {
        recGatherNonPhisDefs
                  (phi,(SparseBitvectorHashImpl *)&local_68,(SparseBitvectorHashImpl *)&local_a8,
                   SUB41(local_bc,0));
      }
      ppRVar11 = ppRVar11 + 1;
    } while (ppRVar11 != ppRVar3);
  }
  pRVar6 = local_b8;
  (__return_storage_ptr__->super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __n = 0;
  for (_Var4._M_nxt = local_a8._M_before_begin._M_nxt;
      (__node_type *)_Var4._M_nxt != (__node_type *)0x0;
      _Var4._M_nxt = ((_Hash_node_base *)&(_Var4._M_nxt)->_M_nxt)->_M_nxt) {
    uVar10 = *(ulong *)((long)&(((__node_type *)_Var4._M_nxt)->
                               super__Hash_node_value<std::pair<const_unsigned_long,_unsigned_long>,_false>
                               ).
                               super__Hash_node_value_base<std::pair<const_unsigned_long,_unsigned_long>_>
                               ._M_storage._M_storage + 8);
    lVar9 = 0;
    if (uVar10 != 0) {
      do {
        lVar9 = lVar9 + (ulong)((uint)uVar10 & 1);
        bVar5 = 1 < uVar10;
        uVar10 = uVar10 >> 1;
      } while (bVar5);
    }
    __n = __n + lVar9;
  }
  std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::reserve
            (__return_storage_ptr__,__n);
  local_d8.container_it.
  super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)
       (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)
       local_a8._M_before_begin._M_nxt;
  local_d8.container_end.
  super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)(__node_type *)0x0
  ;
  local_d8.pos = 0;
  if (local_a8._M_element_count != 0) {
    uVar10 = *(ulong *)((long)&(((_Hash_node_value<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                  *)((long)local_a8._M_before_begin._M_nxt + 8))->
                               super__Hash_node_value_base<std::pair<const_unsigned_long,_unsigned_long>_>
                               )._M_storage._M_storage + 8);
    if ((uVar10 & 1) == 0) {
      local_d8.pos = 0;
      do {
        if (local_d8.pos == 0x3f) {
          local_d8.pos = 0x40;
          break;
        }
        bVar8 = (byte)local_d8.pos;
        local_d8.pos = local_d8.pos + 1;
      } while ((uVar10 >> (bVar8 & 0x3f) & 2) == 0);
    }
    else {
      local_d8.pos = 0;
    }
  }
  if (local_d8.pos != 0 || (__node_type *)local_a8._M_before_begin._M_nxt != (__node_type *)0x0) {
    do {
      local_b0 = *(RWNode **)
                  (*(long *)(pRVar6 + 8) +
                  (ulong)(((int)local_d8.pos +
                          *(int *)&(((_Hash_node_value<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                      *)((long)local_d8.container_it.
                                               super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                               ._M_cur + 8))->
                                   super__Hash_node_value_base<std::pair<const_unsigned_long,_unsigned_long>_>
                                   )._M_storage._M_storage) - 1) * 8);
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>::
        _M_realloc_insert<dg::dda::RWNode*>
                  ((vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>> *)
                   __return_storage_ptr__,__position,&local_b0);
      }
      else {
        *__position._M_current = local_b0;
        pppRVar1 = &(__return_storage_ptr__->
                    super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppRVar1 = *pppRVar1 + 1;
      }
      ADT::
      SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
      ::const_iterator::operator++(&local_d8);
    } while (local_d8.container_it.
             super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur
             != (__node_type *)0x0 || local_d8.pos != 0);
  }
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_a8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<RWNode *> gatherNonPhisDefs(ReadWriteGraph *graph,
                                        const ContT &nodes,
                                        bool intraproc = false) {
    dg::ADT::SparseBitvectorHashImpl ret; // use set to get rid of duplicates
    dg::ADT::SparseBitvectorHashImpl
            phis; // set of visited phi nodes - to check the fixpoint

    for (auto n : nodes) {
        if (!n->isPhi()) {
            assert(n->getID() > 0);
            ret.set(n->getID());
        } else {
            if (intraproc && n->isInOut()) {
                assert(n->getID() > 0);
                ret.set(n->getID());
            } else {
                recGatherNonPhisDefs(n, phis, ret, intraproc);
            }
        }
    }

    std::vector<RWNode *> retval;
    retval.reserve(ret.size());
    for (auto i : ret) {
        retval.push_back(graph->getNode(i));
    }
    return retval;
}